

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::marray_detail::Geometry<std::allocator<unsigned_long>_>::Geometry
          (Geometry<std::allocator<unsigned_long>_> *this,
          Geometry<std::allocator<unsigned_long>_> *g)

{
  unsigned_long *__dest;
  size_t sVar1;
  
  if (g->dimension_ == 0) {
    sVar1 = 0;
    __dest = (unsigned_long *)0x0;
  }
  else {
    __dest = __gnu_cxx::new_allocator<unsigned_long>::allocate
                       ((new_allocator<unsigned_long> *)this,g->dimension_ * 3,(void *)0x0);
    sVar1 = g->dimension_;
  }
  this->shape_ = __dest;
  this->shapeStrides_ = __dest + sVar1;
  this->strides_ = __dest + sVar1 + sVar1;
  this->dimension_ = sVar1;
  this->size_ = g->size_;
  this->coordinateOrder_ = g->coordinateOrder_;
  this->isSimple_ = g->isSimple_;
  memcpy(__dest,g->shape_,sVar1 * 0x18);
  return;
}

Assistant:

inline 
Geometry<A>::Geometry
(
    const Geometry<A>& g
)
: allocator_(g.allocator_),
  shape_(g.dimension_==0 ? 0 : allocator_.allocate(g.dimension_*3)), 
  shapeStrides_(shape_ + g.dimension_), 
  strides_(shapeStrides_ + g.dimension_), 
  dimension_(g.dimension_),
  size_(g.size_), 
  coordinateOrder_(g.coordinateOrder_), 
  isSimple_(g.isSimple_)
{
    /*
    for(std::size_t j=0; j<dimension_; ++j) {
        shape_[j] = g.shape_[j];
        shapeStrides_[j] = g.shapeStrides_[j];
        strides_[j] = g.strides_[j];
    }
    */
    memcpy(shape_, g.shape_, (dimension_*3)*sizeof(std::size_t));
}